

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::BufferWriteTests::init(BufferWriteTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  Context *pCVar2;
  _Alloc_hider name_00;
  deUint32 dVar3;
  int iVar4;
  RecreateBufferDataStoreCase *pRVar5;
  char *pcVar6;
  BasicBufferDataCase *pBVar7;
  TestNode *pTVar8;
  SubDataToUndefinedCase *pSVar9;
  RandomBufferWriteCase *this_00;
  long lVar10;
  long lVar11;
  pointer pDVar12;
  TestNode *this_01;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  RecreateBufferDataStoreCase *local_e0;
  TestNode *local_d8;
  long local_d0;
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  specs_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  value_type local_90;
  value_type local_84;
  TestNode *local_78;
  Random rnd;
  value_type local_60;
  value_type local_54;
  value_type local_48;
  undefined1 *local_3c;
  int local_34;
  
  pRVar5 = (RecreateBufferDataStoreCase *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pRVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic upload with glBufferData()");
  local_e0 = pRVar5;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pRVar5);
  lVar10 = 0;
  local_d8 = (TestNode *)this;
  while (this_01 = local_d8, lVar10 != 8) {
    dVar3 = BufferCopyTests::init::bufferTargets[lVar10];
    local_d0 = lVar10;
    for (lVar11 = 0; lVar11 != 0x24; lVar11 = lVar11 + 4) {
      dVar1 = *(deUint32 *)((long)init::usageHints + lVar11);
      pcVar6 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,pcVar6,(allocator<char> *)&specs_5);
      std::operator+(&local_100,&local_b0,"_");
      pcVar6 = deqp::gls::BufferTestUtil::getUsageHintName(dVar1);
      std::operator+(&name,&local_100,pcVar6);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_b0);
      pBVar7 = (BasicBufferDataCase *)operator_new(0xd0);
      BasicBufferDataCase::BasicBufferDataCase
                (pBVar7,(Context *)local_d8[1]._vptr_TestNode,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,dVar3,dVar1,0x3fc,VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild((TestNode *)local_e0,(TestNode *)pBVar7);
      std::__cxx11::string::~string((string *)&name);
    }
    lVar10 = local_d0 + 1;
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,this_01->m_testCtx,"recreate_store",
             "Data store recreate using glBufferData()");
  tcu::TestNode::addChild(this_01,pTVar8);
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_100._M_dataplus._M_p = (pointer)0x88e400008892;
  local_100._M_string_length._0_4_ = 0x3e4;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x88e400008892;
  local_b0._M_string_length._0_4_ = 0x3e4;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x88e400008892;
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3e4;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&specs_5);
  pRVar5 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar5,(Context *)this_01[1]._vptr_TestNode,"identical_1",
             "Recreate with identical parameters",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pRVar5);
  std::
  _Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                   *)&name);
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_100._M_dataplus._M_p = (pointer)0x88e400008f37;
  local_100._M_string_length._0_4_ = 0x48;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x88e400008f37;
  local_b0._M_string_length._0_4_ = 0x48;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x88e400008f37;
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x48;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&specs_5);
  pRVar5 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar5,(Context *)this_01[1]._vptr_TestNode,"identical_2",
             "Recreate with identical parameters",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pRVar5);
  std::
  _Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                   *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x88e400008892;
  local_100._M_string_length._0_4_ = 0x1f8;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x88e400008f36;
  local_b0._M_string_length._0_4_ = 0x1f8;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x88e400008f37;
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x1f8;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&specs_5);
  rnd.m_rnd.x = 0x8893;
  rnd.m_rnd.y = 0x88e4;
  rnd.m_rnd.z = 0x1f8;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&rnd);
  local_90.target = 0x88eb;
  local_90.usage = 0x88e4;
  local_90.size = 0x1f8;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_90);
  local_84.target = 0x88ec;
  local_84.usage = 0x88e4;
  local_84.size = 0x1f8;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_84);
  local_48.target = 0x8c8e;
  local_48.usage = 0x88e4;
  local_48.size = 0x1f8;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_48);
  local_54.target = 0x8a11;
  local_54.usage = 0x88e4;
  local_54.size = 0x1f8;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_54);
  local_60.target = 0x8892;
  local_60.usage = 0x88e4;
  local_60.size = 0x1f8;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_60);
  pRVar5 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar5,(Context *)this_01[1]._vptr_TestNode,"different_target",
             "Recreate with different target",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pRVar5);
  std::
  _Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                   *)&name);
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_100._M_dataplus._M_p = &DAT_88e000008892;
  local_100._M_string_length._0_4_ = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x88e200008892;
  local_b0._M_string_length._0_4_ = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x88e500008892;
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&specs_5);
  rnd.m_rnd.x = 0x8892;
  rnd.m_rnd.y = 0x88e1;
  rnd.m_rnd.z = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&rnd);
  local_90.target = 0x8892;
  local_90.usage = 0x88ea;
  local_90.size = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_90);
  local_84.target = 0x8892;
  local_84.usage = 0x88e6;
  local_84.size = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_84);
  local_48.target = 0x8892;
  local_48.usage = 0x88e9;
  local_48.size = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_48);
  local_54.target = 0x8892;
  local_54.usage = 0x88e8;
  local_54.size = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_54);
  local_60.target = 0x8892;
  local_60.usage = 0x88e4;
  local_60.size = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_60);
  local_3c = &DAT_88e000008892;
  local_34 = 0x66c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_3c);
  pRVar5 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar5,(Context *)this_01[1]._vptr_TestNode,"different_usage",
             "Recreate with different usage",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pRVar5);
  std::
  _Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                   *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = &DAT_88e000008892;
  local_100._M_string_length._0_4_ = 0x400;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_100);
  local_b0._M_dataplus._M_p = &DAT_88e000008892;
  local_b0._M_string_length._0_4_ = 0xc;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&local_b0);
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_88e000008892;
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xcff;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&specs_5);
  rnd.m_rnd._0_8_ = &DAT_88e000008892;
  rnd.m_rnd.z = 0x5c;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,(value_type *)&rnd);
  local_90._0_8_ = &DAT_88e000008892;
  local_90.size = 0x1e393;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_90);
  local_84._0_8_ = &DAT_88e000008892;
  local_84.size = 0x23b;
  std::
  vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::push_back((vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               *)&name,&local_84);
  pRVar5 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar5,(Context *)this_01[1]._vptr_TestNode,"different_size",
             "Recreate with different size",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xc),
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pRVar5);
  local_78 = pTVar8;
  std::
  _Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                   *)&name);
  deRandom_init(&rnd.m_rnd,0x5d71);
  iVar4 = 0;
  while (iVar4 != 4) {
    std::
    vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
    ::vector(&specs_5,10,(allocator_type *)&name);
    for (pDVar12 = specs_5.
                   super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pDVar12 !=
        (pointer)CONCAT44(specs_5.
                          super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                          specs_5.
                          super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_); pDVar12 = pDVar12 + 1)
    {
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      pDVar12->target = BufferCopyTests::init::bufferTargets[dVar3 & 7];
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      pDVar12->usage = init::usageHints[(ulong)dVar3 % 9];
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      pDVar12->size = dVar3 % 0xfff5 + 0xc;
    }
    local_e0 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    pCVar2 = (Context *)this_01[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"random_",(allocator<char> *)&local_84);
    local_90.target = iVar4 + 1;
    de::toString<int>(&local_b0,(int *)&local_90);
    local_d0 = CONCAT44(local_d0._4_4_,iVar4 + 1);
    std::operator+(&name,&local_100,&local_b0);
    pRVar5 = local_e0;
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (local_e0,pCVar2,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
               specs_5.
               super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (int)((CONCAT44(specs_5.
                               super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               specs_5.
                               super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                               ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                     (long)specs_5.
                           super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc),VERIFY_AS_VERTEX_ARRAY)
    ;
    tcu::TestNode::addChild(local_78,(TestNode *)pRVar5);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_100);
    std::
    _Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
    ::~_Vector_base(&specs_5.
                     super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                   );
    this_01 = local_d8;
    iVar4 = (int)local_d0;
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,this_01->m_testCtx,"basic_subdata",
             "Basic glBufferSubData() usage");
  local_e0 = (RecreateBufferDataStoreCase *)pTVar8;
  tcu::TestNode::addChild(this_01,pTVar8);
  lVar10 = 0;
  while (lVar10 != 8) {
    dVar3 = BufferCopyTests::init::bufferTargets[lVar10];
    local_d0 = lVar10;
    for (lVar11 = 0; lVar11 != 0x24; lVar11 = lVar11 + 4) {
      dVar1 = *(deUint32 *)((long)init::usageHints + lVar11);
      pcVar6 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,pcVar6,(allocator<char> *)&specs_5);
      std::operator+(&local_100,&local_b0,"_");
      pcVar6 = deqp::gls::BufferTestUtil::getUsageHintName(dVar1);
      std::operator+(&name,&local_100,pcVar6);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_b0);
      pBVar7 = (BasicBufferDataCase *)operator_new(0xd0);
      BasicBufferDataCase::BasicBufferDataCase
                (pBVar7,(Context *)local_d8[1]._vptr_TestNode,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,dVar3,dVar1,0x3fc,VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild((TestNode *)local_e0,(TestNode *)pBVar7);
      std::__cxx11::string::~string((string *)&name);
    }
    this_01 = local_d8;
    lVar10 = local_d0 + 1;
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,this_01->m_testCtx,"partial_specify",
             "Partial buffer data specification with glBufferSubData()");
  tcu::TestNode::addChild(this_01,pTVar8);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x3e400000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"whole_1",
             "Whole buffer specification with single glBufferSubData()",0x8892,0x88e4,0x3e4,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x3e7000002d9;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x2d900000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"whole_2",
             "Whole buffer specification with two calls",0x8a11,0x88e9,0x6c0,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x1a500000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x20b0000058d;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8000001a5;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&specs_5);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"whole_3",
             "Whole buffer specification with three calls",0x8c8e,0x88e2,0x798,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x1f400000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0xc8000001ad;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  specs_5.
  super__Vector_base<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2af00000201;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&specs_5);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"whole_4",
             "Whole buffer specification with three calls",0x8c8e,0x88e2,0x4b0,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x20100000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"low_1",
             "Low part of buffer specified with single call",0x8893,0x88e8,1000,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x6200000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x1ff00000062;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"low_2",
             "Low part of buffer specified with two calls",0x8f36,0x88ea,0x3e4,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x24f00000000;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x19000000173;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"low_3",
             "Low part of buffer specified with two calls",0x8f36,0x88ea,0x4b0,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x1f4000001f4;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"high_1",
             "High part of buffer specified with single call",0x8f37,0x88e6,1000,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x7b00000258;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x1dd000002d3;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"high_2",
             "High part of buffer specified with two calls",0x8c8e,0x88e0,0x4b0,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0xc800000258;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x25700000259;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"high_3",
             "High part of buffer specified with two calls",0x88eb,0x88e1,0x4b0,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x31f000003e8;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"middle_1",
             "Middle part of buffer specified with single call",0x88ec,0x88e1,0x9c4,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0xdc0000030c;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x1f4000003e8;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"middle_2",
             "Middle part of buffer specified with two calls",0x8893,0x88e4,0x9c4,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  name.field_2._M_allocated_capacity = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)0x1410000030c;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)0x1f5000003e8;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
             (value_type *)&local_b0);
  pSVar9 = (SubDataToUndefinedCase *)operator_new(0xf0);
  SubDataToUndefinedCase::SubDataToUndefinedCase
            (pSVar9,(Context *)this_01[1]._vptr_TestNode,"middle_3",
             "Middle part of buffer specified with two calls",0x8892,0x88e1,0x9c4,
             (IVec2 *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),VERIFY_AS_VERTEX_ARRAY)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,this_01->m_testCtx,"random","Randomized buffer data cases");
  tcu::TestNode::addChild(this_01,pTVar8);
  iVar4 = 0;
  while (local_100._M_dataplus._M_p._0_4_ = iVar4, iVar4 < 10) {
    this_00 = (RandomBufferWriteCase *)operator_new(0x110);
    pCVar2 = (Context *)this_01[1]._vptr_TestNode;
    de::toString<int>(&name,(int *)&local_100);
    name_00 = name._M_dataplus;
    dVar3 = ::deInt32Hash((int)local_100._M_dataplus._M_p);
    RandomBufferWriteCase::RandomBufferWriteCase
              (this_00,pCVar2,name_00._M_p,glcts::fixed_sample_locations_values + 1,dVar3);
    tcu::TestNode::addChild(pTVar8,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&name);
    this_01 = local_d8;
    iVar4 = (int)local_100._M_dataplus._M_p + 1;
  }
  return iVar4;
}

Assistant:

void BufferWriteTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	static const deUint32 usageHints[] =
	{
		GL_STREAM_DRAW,
		GL_STREAM_READ,
		GL_STREAM_COPY,
		GL_STATIC_DRAW,
		GL_STATIC_READ,
		GL_STATIC_COPY,
		GL_DYNAMIC_DRAW,
		GL_DYNAMIC_READ,
		GL_DYNAMIC_COPY
	};

	// .basic
	{
		tcu::TestCaseGroup* const basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic upload with glBufferData()");
		addChild(basicGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
		{
			for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageHints); usageNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= usageHints[usageNdx];
				const int			size	= 1020;
				const VerifyType	verify	= VERIFY_AS_VERTEX_ARRAY;
				const string		name	= string(getBufferTargetName(target)) + "_" + getUsageHintName(usage);

				basicGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .recreate_store
	{
		tcu::TestCaseGroup* const recreateStoreGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_store", "Data store recreate using glBufferData()");
		addChild(recreateStoreGroup);

#define RECREATE_STORE_CASE(NAME, DESC, SPECLIST)																												\
		do {																																				\
			std::vector<DataStoreSpec> specs;																												\
			DataStoreSpecVecBuilder builder(specs);																											\
			builder SPECLIST;																																\
			recreateStoreGroup->addChild(new RecreateBufferDataStoreCase(m_context, #NAME, DESC, &specs[0], (int)specs.size(), VERIFY_AS_VERTEX_ARRAY));	\
		} while (deGetFalse())

		RECREATE_STORE_CASE(identical_1, "Recreate with identical parameters",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996));

		RECREATE_STORE_CASE(identical_2, "Recreate with identical parameters",
			<< DataStoreSpec(GL_COPY_WRITE_BUFFER, GL_STATIC_DRAW, 72)
			<< DataStoreSpec(GL_COPY_WRITE_BUFFER, GL_STATIC_DRAW, 72)
			<< DataStoreSpec(GL_COPY_WRITE_BUFFER, GL_STATIC_DRAW, 72));

		RECREATE_STORE_CASE(different_target, "Recreate with different target",
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_COPY_READ_BUFFER,			GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_COPY_WRITE_BUFFER,			GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_PIXEL_PACK_BUFFER,			GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_PIXEL_UNPACK_BUFFER,		GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_TRANSFORM_FEEDBACK_BUFFER,	GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_UNIFORM_BUFFER,				GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW, 504));

		RECREATE_STORE_CASE(different_usage, "Recreate with different usage",
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_COPY,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_READ,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_READ,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_DYNAMIC_COPY,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_COPY,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_DYNAMIC_READ,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_DYNAMIC_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW,		1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		1644));

		RECREATE_STORE_CASE(different_size, "Recreate with different size",
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		1024)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		12)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		3327)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		92)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		123795)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STREAM_DRAW,		571));

#undef RECREATE_STORE_CASE

		// Random cases.
		{
			const int			numRandomCases		= 4;
			const int			numUploadsPerCase	= 10;
			const int			minSize				= 12;
			const int			maxSize				= 65536;
			const VerifyType	verify				= VERIFY_AS_VERTEX_ARRAY;
			de::Random			rnd					(23921);

			for (int caseNdx = 0; caseNdx < numRandomCases; caseNdx++)
			{
				vector<DataStoreSpec> specs(numUploadsPerCase);

				for (vector<DataStoreSpec>::iterator spec = specs.begin(); spec != specs.end(); spec++)
				{
					spec->target	= bufferTargets[rnd.getInt(0, DE_LENGTH_OF_ARRAY(bufferTargets)-1)];
					spec->usage		= usageHints[rnd.getInt(0, DE_LENGTH_OF_ARRAY(usageHints)-1)];
					spec->size		= rnd.getInt(minSize, maxSize);
				}

				recreateStoreGroup->addChild(new RecreateBufferDataStoreCase(m_context, (string("random_") + de::toString(caseNdx+1)).c_str(), "", &specs[0], (int)specs.size(), verify));
			}
		}
	}

	// .basic_subdata
	{
		tcu::TestCaseGroup* const basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic_subdata", "Basic glBufferSubData() usage");
		addChild(basicGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
		{
			for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageHints); usageNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= usageHints[usageNdx];
				const int			size	= 1020;
				const VerifyType	verify	= VERIFY_AS_VERTEX_ARRAY;
				const string		name	= string(getBufferTargetName(target)) + "_" + getUsageHintName(usage);

				basicGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .partial_specify
	{
		tcu::TestCaseGroup* const partialSpecifyGroup = new tcu::TestCaseGroup(m_testCtx, "partial_specify", "Partial buffer data specification with glBufferSubData()");
		addChild(partialSpecifyGroup);

#define PARTIAL_SPECIFY_CASE(NAME, DESC, TARGET, USAGE, SIZE, RANGELIST)																									\
		do {																																								\
			std::vector<tcu::IVec2> ranges;																																	\
			RangeVecBuilder builder(ranges);																																\
			builder RANGELIST;																																				\
			partialSpecifyGroup->addChild(new SubDataToUndefinedCase(m_context, #NAME, DESC, TARGET, USAGE, SIZE, &ranges[0], (int)ranges.size(), VERIFY_AS_VERTEX_ARRAY));	\
		} while (deGetFalse())

		PARTIAL_SPECIFY_CASE(whole_1, "Whole buffer specification with single glBufferSubData()", GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996,
			<< IVec2(0, 996));
		PARTIAL_SPECIFY_CASE(whole_2, "Whole buffer specification with two calls", GL_UNIFORM_BUFFER, GL_DYNAMIC_READ, 1728,
			<< IVec2(729, 999)
			<< IVec2(0, 729));
		PARTIAL_SPECIFY_CASE(whole_3, "Whole buffer specification with three calls", GL_TRANSFORM_FEEDBACK_BUFFER, GL_STREAM_COPY, 1944,
			<< IVec2(0, 421)
			<< IVec2(1421, 523)
			<< IVec2(421, 1000));
		PARTIAL_SPECIFY_CASE(whole_4, "Whole buffer specification with three calls", GL_TRANSFORM_FEEDBACK_BUFFER, GL_STREAM_COPY, 1200,
			<< IVec2(0, 500)
			<< IVec2(429, 200)
			<< IVec2(513, 687));

		PARTIAL_SPECIFY_CASE(low_1, "Low part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 1000,
			<< IVec2(0, 513));
		PARTIAL_SPECIFY_CASE(low_2, "Low part of buffer specified with two calls", GL_COPY_READ_BUFFER, GL_DYNAMIC_COPY, 996,
			<< IVec2(0, 98)
			<< IVec2(98, 511));
		PARTIAL_SPECIFY_CASE(low_3, "Low part of buffer specified with two calls", GL_COPY_READ_BUFFER, GL_DYNAMIC_COPY, 1200,
			<< IVec2(0, 591)
			<< IVec2(371, 400));

		PARTIAL_SPECIFY_CASE(high_1, "High part of buffer specified with single call", GL_COPY_WRITE_BUFFER, GL_STATIC_COPY, 1000,
			<< IVec2(500, 500));
		PARTIAL_SPECIFY_CASE(high_2, "High part of buffer specified with two calls", GL_TRANSFORM_FEEDBACK_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(600, 123)
			<< IVec2(723, 477));
		PARTIAL_SPECIFY_CASE(high_3, "High part of buffer specified with two calls", GL_PIXEL_PACK_BUFFER, GL_STREAM_READ, 1200,
			<< IVec2(600, 200)
			<< IVec2(601, 599));

		PARTIAL_SPECIFY_CASE(middle_1, "Middle part of buffer specified with single call", GL_PIXEL_UNPACK_BUFFER, GL_STREAM_READ, 2500,
			<< IVec2(1000, 799));
		PARTIAL_SPECIFY_CASE(middle_2, "Middle part of buffer specified with two calls", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 2500,
			<< IVec2(780, 220)
			<< IVec2(1000, 500));
		PARTIAL_SPECIFY_CASE(middle_3, "Middle part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STREAM_READ, 2500,
			<< IVec2(780, 321)
			<< IVec2(1000, 501));

#undef PARTIAL_SPECIFY_CASE
	}

	// .random
	{
		tcu::TestCaseGroup* const randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized buffer data cases");
		addChild(randomGroup);

		for (int i = 0; i < 10; i++)
			randomGroup->addChild(new RandomBufferWriteCase(m_context, de::toString(i).c_str(), "", deInt32Hash(i)));
	}
}